

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_model.h
# Opt level: O1

void __thiscall
mp::FlatModel<mp::DefaultFlatModelParams>::
PushModelTo<TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>>
          (FlatModel<mp::DefaultFlatModelParams> *this,
          TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>
          *mapi)

{
  CreateFlatModelInfo(this,&mapi->super_BasicFlatModelAPI);
  (mapi->super_BasicFlatModelAPI).pfmi_ =
       (this->pfmi_)._M_t.
       super___uniq_ptr_impl<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_>._M_t.
       super__Tuple_impl<0UL,_mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>.
       super__Head_base<0UL,_mp::FlatModelInfo_*,_false>._M_head_impl;
  PushVariablesTo<TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>>
            (this,mapi);
  ConstraintManager::AddUnbridgedConstraintsToBackend
            (&this->super_ConstraintManager,&mapi->super_BasicFlatModelAPI,&this->var_namer_);
  ConstraintManager::LogConstraintGroups
            (&this->super_ConstraintManager,&mapi->super_BasicFlatModelAPI);
  if (this->if_skip_push_objs_bjs_ != false) {
    return;
  }
  PushObjectivesTo<TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>>
            (this,mapi);
  return;
}

Assistant:

void PushModelTo(ModelAPI& mapi) const {
    CreateFlatModelInfo(mapi);
    mapi.PassFlatModelInfo(GetModelInfo());

    mapi.InitProblemModificationPhase(GetModelInfo());
    PushVariablesTo(mapi);
    PushCustomConstraintsTo(mapi);
    if (!if_skip_pushing_objs())
      PushObjectivesTo(mapi);
    mapi.FinishProblemModificationPhase();
  }